

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::InputFloat(char *label,float *v,float step,float step_fast,int decimal_precision,
                      ImGuiInputTextFlags extra_flags)

{
  bool bVar1;
  ImGuiInputTextFlags *local_60;
  int *local_50;
  char local_38 [8];
  char display_format [16];
  ImGuiInputTextFlags extra_flags_local;
  int decimal_precision_local;
  float step_fast_local;
  float step_local;
  float *v_local;
  char *label_local;
  
  display_format._8_4_ = extra_flags;
  display_format._12_4_ = decimal_precision;
  extra_flags_local = (ImGuiInputTextFlags)step_fast;
  decimal_precision_local = (int)step;
  _step_fast_local = v;
  v_local = (float *)label;
  if (decimal_precision < 0) {
    strcpy(local_38,"%f");
  }
  else {
    ImFormatString(local_38,0x10,"%%.%df",(ulong)(uint)decimal_precision);
  }
  if ((float)decimal_precision_local <= 0.0) {
    local_50 = (int *)0x0;
  }
  else {
    local_50 = &decimal_precision_local;
  }
  if ((float)extra_flags_local <= 0.0) {
    local_60 = (ImGuiInputTextFlags *)0x0;
  }
  else {
    local_60 = &extra_flags_local;
  }
  bVar1 = InputScalarEx((char *)v_local,ImGuiDataType_Float,_step_fast_local,local_50,local_60,
                        local_38,display_format._8_4_);
  return bVar1;
}

Assistant:

bool ImGui::InputFloat(const char* label, float* v, float step, float step_fast, int decimal_precision, ImGuiInputTextFlags extra_flags)
{
    char display_format[16];
    if (decimal_precision < 0)
        strcpy(display_format, "%f");      // Ideally we'd have a minimum decimal precision of 1 to visually denote that this is a float, while hiding non-significant digits? %f doesn't have a minimum of 1
    else
        ImFormatString(display_format, 16, "%%.%df", decimal_precision);
    return InputScalarEx(label, ImGuiDataType_Float, (void*)v, (void*)(step>0.0f ? &step : NULL), (void*)(step_fast>0.0f ? &step_fast : NULL), display_format, extra_flags);
}